

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsSetEmbedderData(JsValueRef instance,JsValueRef embedderData)

{
  anon_class_16_2_a907a586 fn;
  JsValueRef local_20;
  JsValueRef embedderData_local;
  JsValueRef instance_local;
  
  if (instance == (JsValueRef)0x0) {
    instance_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    fn.embedderData = &local_20;
    fn.instance = &embedderData_local;
    local_20 = embedderData;
    embedderData_local = instance;
    instance_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsSetEmbedderData::__0>(fn,false,false);
  }
  return instance_local._4_4_;
}

Assistant:

CHAKRA_API
JsSetEmbedderData(_In_ JsValueRef instance, _In_ JsValueRef embedderData)
{
   VALIDATE_JSREF(instance);
   return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        Js::RecyclableObject* object = Js::JavascriptOperators::TryFromVar<Js::RecyclableObject>(instance);
        if (!object)
        {
            return JsErrorInvalidArgument;
        }

        // Right now we know that we support these many. Lets find out if
        // there are more.
        Assert(Js::TypedArrayBase::Is(object->GetTypeId()) ||
               object->GetTypeId() == Js::TypeIds_ArrayBuffer ||
               object->GetTypeId() == Js::TypeIds_DataView ||
               object->GetTypeId() == Js::TypeIds_SharedArrayBuffer);

        if (!object->SetInternalProperty(Js::InternalPropertyIds::EmbedderData, embedderData, Js::PropertyOperationFlags::PropertyOperation_None, nullptr))
        {
           return JsErrorInvalidArgument;
        }

        return JsNoError;
    });
}